

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::ShaderGLImpl,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
               (ComputePipelineStateCreateInfo *CreateInfo,
               vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  char (*Args_1) [60];
  IShader *pIVar3;
  RefCntAutoPtr<Diligent::ShaderGLImpl> pShaderImpl;
  string msg;
  RefCntAutoPtr<Diligent::ShaderGLImpl> local_50;
  string local_48;
  
  Args_1 = (char (*) [60])ActiveShaderStages;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[39]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsComputePipeline()",
               (char (*) [39])ActiveShaderStages);
    Args_1 = (char (*) [60])0x101;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x101);
    std::__cxx11::string::~string((string *)&local_48);
  }
  ppSVar1 = (ShaderStages->
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ShaderStages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    (ShaderStages->
    super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>)._M_impl
    .super__Vector_impl_data._M_finish = ppSVar1;
  }
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[57]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE",
               (char (*) [57])Args_1);
    Args_1 = (char (*) [60])0x105;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x105);
    std::__cxx11::string::~string((string *)&local_48);
  }
  pIVar3 = CreateInfo->pCS;
  if (pIVar3 == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS != nullptr",(char (*) [26])Args_1);
    Args_1 = (char (*) [60])0x106;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x106);
    std::__cxx11::string::~string((string *)&local_48);
    pIVar3 = CreateInfo->pCS;
  }
  iVar2 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 8) != 0x20) {
    FormatString<char[26],char[60]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE",Args_1);
    Args_1 = (char (*) [60])0x107;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x107);
    std::__cxx11::string::~string((string *)&local_48);
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::RefCntAutoPtr
            (&local_50,(IObject *)CreateInfo->pCS,(INTERFACE_ID *)ShaderGLImpl::IID_InternalImpl);
  if (local_50.m_pObject == (ShaderGLImpl *)0x0) {
    FormatString<char[40]>(&local_48,(char (*) [40])"Unexpected shader object implementation");
    Args_1 = (char (*) [60])0x10a;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10a);
    std::__cxx11::string::~string((string *)&local_48);
  }
  WaitUntilShaderReadyIfRequested<Diligent::ShaderGLImpl>(&local_50,WaitUntilShadersReady);
  std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>::
  emplace_back<Diligent::RefCntAutoPtr<Diligent::ShaderGLImpl>&>
            ((vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>> *)ShaderStages
             ,&local_50);
  *ActiveShaderStages = SHADER_TYPE_COMPUTE;
  if ((ShaderStages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (ShaderStages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])Args_1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10f);
    std::__cxx11::string::~string((string *)&local_48);
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::Release(&local_50);
  return;
}

Assistant:

void ExtractShaders(const ComputePipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                        ShaderStages,
                    bool                                  WaitUntilShadersReady,
                    SHADER_TYPE&                          ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsComputePipeline());

    ShaderStages.clear();

    VERIFY_EXPR(CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE);
    VERIFY_EXPR(CreateInfo.pCS != nullptr);
    VERIFY_EXPR(CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE);

    RefCntAutoPtr<ShaderImplType> pShaderImpl{CreateInfo.pCS, ShaderImplType::IID_InternalImpl};
    VERIFY(pShaderImpl, "Unexpected shader object implementation");
    WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
    ShaderStages.emplace_back(pShaderImpl);
    ActiveShaderStages = SHADER_TYPE_COMPUTE;

    VERIFY_EXPR(!ShaderStages.empty());
}